

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  byte bVar1;
  Extension *pEVar2;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar3;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar4;
  LogMessageFatal LStack_38;
  
  pVar4 = Insert(this,number);
  pEVar2 = pVar4.first;
  pEVar2->descriptor = desc;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar2->is_repeated = true;
    bVar1 = pEVar2->field_0xa;
    pEVar2->field_0xa = bVar1 | 1;
    pEVar2->type = field_type;
    pEVar2->is_packed = packed;
    if ((bVar1 & 2) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x196,"!extension->is_cleared");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
    }
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)field_type * 4)) {
    case 1:
    case 8:
      aVar3 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<int>>(this->arena_);
      break;
    case 2:
      aVar3 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<long>>(this->arena_);
      break;
    case 3:
      aVar3 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_int>>
                        (this->arena_);
      break;
    case 4:
      aVar3 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_long>>
                        (this->arena_);
      break;
    case 5:
      aVar3 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<double>>(this->arena_);
      break;
    case 6:
      aVar3 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<float>>(this->arena_);
      break;
    case 7:
      aVar3 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<bool>>(this->arena_);
      break;
    case 9:
      aVar3 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                        (this->arena_);
      break;
    case 10:
      aVar3 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::
              CreateArenaCompatible<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                        (this->arena_);
      break;
    default:
      goto switchD_001b4f14_default;
    }
    pEVar2->field_0 = aVar3;
  }
switchD_001b4f14_default:
  return (void *)(pEVar2->field_0).int64_t_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->type = field_type;
    extension->is_packed = packed;
    ABSL_DCHECK(!extension->is_cleared);

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->ptr.repeated_int32_t_value =
            Arena::Create<RepeatedField<int32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->ptr.repeated_int64_t_value =
            Arena::Create<RepeatedField<int64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->ptr.repeated_uint32_t_value =
            Arena::Create<RepeatedField<uint32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->ptr.repeated_uint64_t_value =
            Arena::Create<RepeatedField<uint64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->ptr.repeated_double_value =
            Arena::Create<RepeatedField<double>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->ptr.repeated_float_value =
            Arena::Create<RepeatedField<float>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->ptr.repeated_bool_value =
            Arena::Create<RepeatedField<bool>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->ptr.repeated_enum_value =
            Arena::Create<RepeatedField<int>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->ptr.repeated_string_value =
            Arena::Create<RepeatedPtrField<std::string>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->ptr.repeated_message_value =
            Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->ptr.repeated_int32_t_value;
}